

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

int4 __thiscall ParamEntry::justifiedContain(ParamEntry *this,Address *addr,int4 sz)

{
  int *piVar1;
  undefined8 *puVar2;
  JoinRecord *pJVar3;
  pointer pVVar4;
  ulong uVar5;
  bool bVar6;
  int4 iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  Address entry;
  
  pJVar3 = this->joinrec;
  if (pJVar3 == (JoinRecord *)0x0) {
    if (this->alignment == 0) {
      entry.base = this->spaceid;
      entry.offset = this->addressbase;
      iVar8 = Address::justifiedContain(&entry,this->size,addr,sz,(bool)((byte)this->flags & 1));
    }
    else {
      iVar8 = -1;
      if (this->spaceid == addr->base) {
        uVar9 = addr->offset;
        uVar5 = this->addressbase;
        if (((uVar5 <= uVar9) && (uVar13 = ((long)sz - 1U) + uVar9, !CARRY8((long)sz - 1U,uVar9)))
           && (uVar13 <= ((long)this->size + uVar5) - 1)) {
          bVar6 = isLeftJustified(this);
          if (bVar6) {
            iVar8 = (int)((uVar9 - uVar5) % (ulong)(long)this->alignment);
          }
          else {
            iVar10 = (int)(((uVar13 - uVar5) + 1) % (ulong)(long)this->alignment);
            iVar8 = this->alignment - iVar10;
            if (iVar10 == 0) {
              iVar8 = 0;
            }
          }
        }
      }
    }
  }
  else {
    uVar9 = ((long)(pJVar3->pieces).super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(pJVar3->pieces).super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x18;
    iVar11 = (int)uVar9 + 1;
    lVar12 = (uVar9 & 0xffffffff) * 0x18 + -8;
    iVar10 = 0;
    do {
      iVar8 = iVar10;
      iVar11 = iVar11 + -1;
      if (iVar11 < 1) {
        return -1;
      }
      pVVar4 = (this->joinrec->pieces).super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (undefined8 *)((long)pVVar4 + lVar12 + -0x10);
      entry.base = (AddrSpace *)*puVar2;
      entry.offset = puVar2[1];
      iVar7 = Address::justifiedContain
                        (&entry,*(int4 *)((long)&pVVar4->space + lVar12),addr,sz,false);
      piVar1 = (int *)((long)&pVVar4->space + lVar12);
      lVar12 = lVar12 + -0x18;
      iVar10 = *piVar1 + iVar8;
    } while (iVar7 < 0);
    iVar8 = iVar7 + iVar8;
  }
  return iVar8;
}

Assistant:

int4 ParamEntry::justifiedContain(const Address &addr,int4 sz) const

{
  if (joinrec != (JoinRecord *)0) {
    int4 res = 0;
    for(int4 i=joinrec->numPieces()-1;i>=0;--i) { // Move from least significant to most
      const VarnodeData &vdata(joinrec->getPiece(i));
      int4 cur = vdata.getAddr().justifiedContain(vdata.size,addr,sz,false);
      if (cur<0)
	res += vdata.size;	// We skipped this many less significant bytes
      else {
	return res + cur;
      }
    }
    return -1;			// Not contained at all
  }
  if (alignment==0) {
    // Ordinary endian containment
    Address entry(spaceid,addressbase);
    return entry.justifiedContain(size,addr,sz,((flags&force_left_justify)!=0));
  }
  if (spaceid != addr.getSpace()) return -1;
  uintb startaddr = addr.getOffset();
  if (startaddr < addressbase) return -1;
  uintb endaddr = startaddr + sz - 1;
  if (endaddr < startaddr) return -1; // Don't allow wrap around
  if (endaddr > (addressbase+size-1)) return -1;
  startaddr -= addressbase;
  endaddr -= addressbase;
  if (!isLeftJustified()) {   // For right justified (big endian), endaddr must be aligned
    int4 res = (int4)((endaddr+1) % alignment);
    if (res==0) return 0;
    return (alignment-res);
  }
  return (int4)(startaddr % alignment);
}